

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  size_type sVar1;
  ulong uVar2;
  uint uVar3;
  path *__p;
  long lVar4;
  ostream *poVar5;
  directory_iterator __begin1;
  string dir;
  directory_iterator local_b8;
  directory_iterator local_a8;
  long *local_98;
  long local_90;
  long local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  path local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/","");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,&local_78,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_a8,&local_58,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_58);
  if (local_a8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_b8._M_dir._M_ptr = local_a8._M_dir._M_ptr;
    local_b8._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_b8._M_dir._M_ptr = local_a8._M_dir._M_ptr;
      local_b8._M_dir._M_refcount._M_pi = local_a8._M_dir._M_refcount._M_pi;
      if (local_a8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00102364;
    }
    else {
      *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_b8._M_dir._M_ptr = local_a8._M_dir._M_ptr;
    local_b8._M_dir._M_refcount._M_pi = local_a8._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_a8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_dir._M_refcount._M_pi)
    ;
  }
LAB_00102364:
  do {
    if (local_b8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_a8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8._M_dir._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      return 0;
    }
    __p = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"name: ",6);
    sVar1 = (__p->_M_pathname)._M_string_length;
    if (sVar1 == 0) {
LAB_00102404:
      std::filesystem::__cxx11::path::path(&local_58);
    }
    else {
      uVar2 = *(ulong *)&__p->_M_cmpts;
      uVar3 = (uint)uVar2;
      if ((~(byte)uVar2 & 3) != 0) {
        if (((uVar2 & 3) == 0) && ((__p->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
          if ((uVar2 & 3) == 0) {
            lVar4 = std::filesystem::__cxx11::path::_List::end();
            if ((*(ulong *)&__p->_M_cmpts & 3) == 0) {
              __p = (path *)(lVar4 + -0x30);
            }
            uVar3 = (uint)*(undefined8 *)&__p->_M_cmpts;
          }
          if ((~uVar3 & 3) == 0) goto LAB_001023f7;
        }
        goto LAB_00102404;
      }
LAB_001023f7:
      std::filesystem::__cxx11::path::path(&local_58,__p);
    }
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,local_58._M_pathname._M_dataplus._M_p,
               local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_98,local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_58);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_b8);
  } while( true );
}

Assistant:

int main() {
    std::string dir = "/";

    try {
        for (const auto& entry : std::filesystem::directory_iterator(dir)) {
            std::cout << "name: " << entry.path().filename().string() << "\n";
        }
    } catch (std::filesystem::filesystem_error& e) {
        std::cout << "An error has occurred: " << e.what() << '\n';
    }

    return 0;
}